

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

bool __thiscall
beast::detail::LexicalCast<int,_char_*>::operator()
          (LexicalCast<int,_char_*> *this,int *out,char *in)

{
  enable_if_t<std::is_signed<int>::value,_bool> eVar1;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  char *local_20;
  char *in_local;
  int *out_local;
  LexicalCast<int,_char_*> *this_local;
  
  local_20 = in;
  in_local = (char *)out;
  out_local = (int *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,in,&local_49);
  eVar1 = LexicalCast<int,std::__cxx11::string>::operator()(&local_21,out,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return eVar1;
}

Assistant:

bool operator() (Out& out, char* in) const
    {
        return LexicalCast <Out, std::string>()(out, in);
    }